

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
zetGetMetricDecoderExpProcAddrTable
          (ze_api_version_t version,zet_metric_decoder_exp_dditable_t *pDdiTable)

{
  bool bVar1;
  size_type sVar2;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar3;
  reference pvVar4;
  code *pcVar5;
  zet_pfnGetMetricDecoderExpProcAddrTable_t getTable_1;
  zet_pfnGetMetricDecoderExpProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  ze_result_t result;
  zet_metric_decoder_exp_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar2 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar2 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (zet_metric_decoder_exp_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    __range1._4_4_ = ZE_RESULT_SUCCESS;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar1) {
      pdVar3 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&__end1);
      if ((pdVar3->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar5 = (code *)dlsym(pdVar3->handle,"zetGetMetricDecoderExpProcAddrTable"),
         pcVar5 != (code *)0x0)) {
        __range1._4_4_ = (*pcVar5)(version,&(pdVar3->dditable).zet.MetricDecoderExp);
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar2 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar2 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar4 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                           ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                            (loader::context + 0x15e0));
        pDdiTable->pfnCreateExp = (pvVar4->dditable).zet.MetricDecoderExp.pfnCreateExp;
        pDdiTable->pfnDestroyExp = (pvVar4->dditable).zet.MetricDecoderExp.pfnDestroyExp;
        pDdiTable->pfnGetDecodableMetricsExp =
             (pvVar4->dditable).zet.MetricDecoderExp.pfnGetDecodableMetricsExp;
      }
      else {
        pDdiTable->pfnCreateExp = loader::zetMetricDecoderCreateExp;
        pDdiTable->pfnDestroyExp = loader::zetMetricDecoderDestroyExp;
        pDdiTable->pfnGetDecodableMetricsExp = loader::zetMetricDecoderGetDecodableMetricsExp;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar5 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),
                             "zetGetMetricDecoderExpProcAddrTable");
      if (pcVar5 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar5)(version,pDdiTable);
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricDecoderExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_decoder_exp_dditable_t* pDdiTable    ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zet_pfnGetMetricDecoderExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zetGetMetricDecoderExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.zet.MetricDecoderExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnCreateExp                                = loader::zetMetricDecoderCreateExp;
            pDdiTable->pfnDestroyExp                               = loader::zetMetricDecoderDestroyExp;
            pDdiTable->pfnGetDecodableMetricsExp                   = loader::zetMetricDecoderGetDecodableMetricsExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.zet.MetricDecoderExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zet_pfnGetMetricDecoderExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zetGetMetricDecoderExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}